

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::post_trackers(torrent *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined1 local_48 [40];
  vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_> t;
  torrent *this_local;
  
  t.
  super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  trackers((vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
            *)(local_48 + 0x20),this);
  iVar1 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [5])();
  get_handle((torrent *)local_48);
  alert_manager::
  emplace_alert<libtorrent::tracker_list_alert,libtorrent::torrent_handle,std::vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>>
            ((alert_manager *)CONCAT44(extraout_var,iVar1),(torrent_handle *)local_48,
             (vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
              *)(local_48 + 0x20));
  torrent_handle::~torrent_handle((torrent_handle *)local_48);
  ::std::vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
  ::~vector((vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
             *)(local_48 + 0x20));
  return;
}

Assistant:

void torrent::post_trackers()
	{
		auto t = trackers();
		m_ses.alerts().emplace_alert<tracker_list_alert>(get_handle(), std::move(t));
	}